

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void ARGBQuantizeRow_SSE2
               (uint8_t *dst_argb,int scale,int interval_size,int interval_offset,int width)

{
  bool bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  int iVar15;
  short sVar16;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  undefined1 auVar17 [16];
  short sVar24;
  short sVar25;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  short sVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  undefined1 auVar41 [16];
  
  auVar35 = pshuflw(ZEXT416((uint)scale),ZEXT416((uint)scale),0x40);
  auVar36._0_8_ = auVar35._0_8_;
  auVar36._8_4_ = auVar35._0_4_;
  auVar36._12_4_ = auVar35._4_4_;
  auVar35 = pshuflw(ZEXT416((uint)interval_size),ZEXT416((uint)interval_size),0x40);
  auVar41 = pshuflw(ZEXT416((uint)interval_offset),ZEXT416((uint)interval_offset),0x40);
  do {
    auVar17 = *(undefined1 (*) [16])dst_argb;
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar17._0_13_;
    auVar2[0xe] = auVar17[7];
    auVar3[0xc] = auVar17[6];
    auVar3._0_12_ = auVar17._0_12_;
    auVar3._13_2_ = auVar2._13_2_;
    auVar4[0xb] = 0;
    auVar4._0_11_ = auVar17._0_11_;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5[10] = auVar17[5];
    auVar5._0_10_ = auVar17._0_10_;
    auVar5._11_4_ = auVar4._11_4_;
    auVar6[9] = 0;
    auVar6._0_9_ = auVar17._0_9_;
    auVar6._10_5_ = auVar5._10_5_;
    auVar7[8] = auVar17[4];
    auVar7._0_8_ = auVar17._0_8_;
    auVar7._9_6_ = auVar6._9_6_;
    auVar12._7_8_ = 0;
    auVar12._0_7_ = auVar7._8_7_;
    auVar13._1_8_ = SUB158(auVar12 << 0x40,7);
    auVar13[0] = auVar17[3];
    auVar13._9_6_ = 0;
    auVar14._1_10_ = SUB1510(auVar13 << 0x30,5);
    auVar14[0] = auVar17[2];
    auVar14._11_4_ = 0;
    auVar27._3_12_ = SUB1512(auVar14 << 0x20,3);
    auVar27[2] = auVar17[1];
    auVar27[0] = auVar17[0];
    auVar27[1] = 0;
    auVar27[0xf] = 0;
    auVar17 = pmulhuw(auVar27,auVar36);
    auVar26[1] = 0;
    auVar26[0] = (*(undefined1 (*) [16])dst_argb)[8];
    auVar26[2] = (*(undefined1 (*) [16])dst_argb)[9];
    auVar26[3] = 0;
    auVar26[4] = (*(undefined1 (*) [16])dst_argb)[10];
    auVar26[5] = 0;
    auVar26[6] = (*(undefined1 (*) [16])dst_argb)[0xb];
    auVar26[7] = 0;
    auVar26[8] = (*(undefined1 (*) [16])dst_argb)[0xc];
    auVar26[9] = 0;
    auVar26[10] = (*(undefined1 (*) [16])dst_argb)[0xd];
    auVar26[0xb] = 0;
    auVar26[0xc] = (*(undefined1 (*) [16])dst_argb)[0xe];
    auVar26[0xd] = 0;
    auVar26[0xe] = (*(undefined1 (*) [16])dst_argb)[0xf];
    auVar26[0xf] = 0;
    auVar27 = pmulhuw(auVar26,auVar36);
    sVar37 = auVar35._0_2_;
    sVar38 = auVar35._2_2_;
    sVar39 = auVar35._4_2_;
    sVar40 = auVar35._6_2_;
    bVar8 = (*(undefined1 (*) [16])dst_argb)[3];
    bVar9 = (*(undefined1 (*) [16])dst_argb)[7];
    bVar10 = (*(undefined1 (*) [16])dst_argb)[0xb];
    bVar11 = (*(undefined1 (*) [16])dst_argb)[0xf];
    sVar31 = auVar41._0_2_;
    sVar16 = auVar17._0_2_ * sVar37 + sVar31;
    sVar32 = auVar41._2_2_;
    sVar18 = auVar17._2_2_ * sVar38 + sVar32;
    sVar33 = auVar41._4_2_;
    sVar19 = auVar17._4_2_ * sVar39 + sVar33;
    sVar34 = auVar41._6_2_;
    sVar20 = auVar17._6_2_ * sVar40 + sVar34;
    sVar21 = auVar17._8_2_ * sVar37 + sVar31;
    sVar22 = auVar17._10_2_ * sVar38 + sVar32;
    sVar23 = auVar17._12_2_ * sVar39 + sVar33;
    sVar24 = auVar17._14_2_ * sVar40 + sVar34;
    sVar25 = auVar27._0_2_ * sVar37 + sVar31;
    sVar28 = auVar27._2_2_ * sVar38 + sVar32;
    sVar29 = auVar27._4_2_ * sVar39 + sVar33;
    sVar30 = auVar27._6_2_ * sVar40 + sVar34;
    sVar31 = auVar27._8_2_ * sVar37 + sVar31;
    sVar32 = auVar27._10_2_ * sVar38 + sVar32;
    sVar33 = auVar27._12_2_ * sVar39 + sVar33;
    sVar34 = auVar27._14_2_ * sVar40 + sVar34;
    (*(undefined1 (*) [16])dst_argb)[0] =
         (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    (*(undefined1 (*) [16])dst_argb)[1] =
         (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    (*(undefined1 (*) [16])dst_argb)[2] =
         (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    (*(undefined1 (*) [16])dst_argb)[3] =
         (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20) | bVar8;
    (*(undefined1 (*) [16])dst_argb)[4] =
         (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    (*(undefined1 (*) [16])dst_argb)[5] =
         (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    (*(undefined1 (*) [16])dst_argb)[6] =
         (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    (*(undefined1 (*) [16])dst_argb)[7] =
         (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24) | bVar9;
    (*(undefined1 (*) [16])dst_argb)[8] =
         (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
    (*(undefined1 (*) [16])dst_argb)[9] =
         (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
    (*(undefined1 (*) [16])dst_argb)[10] =
         (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
    (*(undefined1 (*) [16])dst_argb)[0xb] =
         (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30) | bVar10;
    (*(undefined1 (*) [16])dst_argb)[0xc] =
         (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
    (*(undefined1 (*) [16])dst_argb)[0xd] =
         (0 < sVar32) * (sVar32 < 0x100) * (char)sVar32 - (0xff < sVar32);
    (*(undefined1 (*) [16])dst_argb)[0xe] =
         (0 < sVar33) * (sVar33 < 0x100) * (char)sVar33 - (0xff < sVar33);
    (*(undefined1 (*) [16])dst_argb)[0xf] =
         (0 < sVar34) * (sVar34 < 0x100) * (char)sVar34 - (0xff < sVar34) | bVar11;
    dst_argb = (uint8_t *)((long)dst_argb + 0x10);
    iVar15 = width + -4;
    bVar1 = 3 < width;
    width = iVar15;
  } while (iVar15 != 0 && bVar1);
  return;
}

Assistant:

void ARGBQuantizeRow_SSE2(uint8_t* dst_argb,
                          int scale,
                          int interval_size,
                          int interval_offset,
                          int width) {
  asm volatile(
      "movd        %2,%%xmm2                     \n"
      "movd        %3,%%xmm3                     \n"
      "movd        %4,%%xmm4                     \n"
      "pshuflw     $0x40,%%xmm2,%%xmm2           \n"
      "pshufd      $0x44,%%xmm2,%%xmm2           \n"
      "pshuflw     $0x40,%%xmm3,%%xmm3           \n"
      "pshufd      $0x44,%%xmm3,%%xmm3           \n"
      "pshuflw     $0x40,%%xmm4,%%xmm4           \n"
      "pshufd      $0x44,%%xmm4,%%xmm4           \n"
      "pxor        %%xmm5,%%xmm5                 \n"
      "pcmpeqb     %%xmm6,%%xmm6                 \n"
      "pslld       $0x18,%%xmm6                  \n"

      // 4 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "punpcklbw   %%xmm5,%%xmm0                 \n"
      "pmulhuw     %%xmm2,%%xmm0                 \n"
      "movdqu      (%0),%%xmm1                   \n"
      "punpckhbw   %%xmm5,%%xmm1                 \n"
      "pmulhuw     %%xmm2,%%xmm1                 \n"
      "pmullw      %%xmm3,%%xmm0                 \n"
      "movdqu      (%0),%%xmm7                   \n"
      "pmullw      %%xmm3,%%xmm1                 \n"
      "pand        %%xmm6,%%xmm7                 \n"
      "paddw       %%xmm4,%%xmm0                 \n"
      "paddw       %%xmm4,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "por         %%xmm7,%%xmm0                 \n"
      "movdqu      %%xmm0,(%0)                   \n"
      "lea         0x10(%0),%0                   \n"
      "sub         $0x4,%1                       \n"
      "jg          1b                            \n"
      : "+r"(dst_argb),       // %0
        "+r"(width)           // %1
      : "r"(scale),           // %2
        "r"(interval_size),   // %3
        "r"(interval_offset)  // %4
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6",
        "xmm7");
}